

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float pbrt::MISWeight(Integrator *integrator,Vertex *lightVertices,Vertex *cameraVertices,
                     Vertex *sampled,int s,int t,LightSamplerHandle *lightSampler)

{
  Vertex *target;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte bVar6;
  bool *pbVar7;
  int iVar8;
  Vertex *next;
  Vertex *this;
  ulong uVar9;
  Vertex *prev;
  bool *pbVar10;
  Float *pFVar11;
  Float *pFVar12;
  ulong uVar13;
  Float *pFVar14;
  float fVar15;
  undefined1 auVar17 [16];
  Float FVar18;
  Float FVar19;
  float fVar20;
  undefined1 auVar21 [16];
  ScopedAssignment<pbrt::Vertex> a1;
  bool local_7aa;
  bool local_7a9;
  bool *local_7a8;
  Float *local_788;
  Vertex *local_780;
  Float local_778;
  Float local_770;
  Float local_76c;
  Float *local_768;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_728;
  Vertex *local_720;
  Vertex local_718;
  ScopedAssignment<pbrt::Vertex> local_5b8;
  Vertex local_450;
  Vertex local_2f0;
  Vertex local_190;
  undefined1 auVar16 [16];
  
  uVar9 = (ulong)(uint)s;
  if (t + s == 2) {
    return 1.0;
  }
  uVar13 = (ulong)(uint)t;
  target = lightVertices + (uVar9 - 1);
  next = (Vertex *)0x0;
  if (0 < s) {
    next = target;
  }
  this = (Vertex *)0x0;
  if (0 < t) {
    this = cameraVertices + (uVar13 - 1);
  }
  prev = lightVertices + (uVar9 - 2);
  if (s < 2) {
    prev = (Vertex *)0x0;
  }
  local_780 = cameraVertices + (uVar13 - 2);
  if (t < 2) {
    local_780 = (Vertex *)0x0;
  }
  Vertex::Vertex(&local_190);
  local_720 = (Vertex *)0x0;
  Vertex::Vertex(&local_718);
  if (s == 1) {
    Vertex::Vertex(&local_2f0,sampled);
    ScopedAssignment<pbrt::Vertex>::ScopedAssignment(&local_5b8,target,&local_2f0);
    local_720 = local_5b8.target;
    memcpy(&local_718,&local_5b8.backup,0x160);
  }
  else if (t == 1) {
    Vertex::Vertex(&local_450,sampled);
    ScopedAssignment<pbrt::Vertex>::ScopedAssignment
              (&local_5b8,cameraVertices + (uVar13 - 1),&local_450);
    local_720 = local_5b8.target;
    memcpy(&local_718,&local_5b8.backup,0x160);
  }
  if (this == (Vertex *)0x0) {
    local_7a8 = (bool *)0x0;
  }
  else {
    local_7a9 = this->delta;
    local_7a8 = &this->delta;
    this->delta = false;
  }
  if (next == (Vertex *)0x0) {
    pbVar10 = (bool *)0x0;
  }
  else {
    local_7aa = next->delta;
    pbVar10 = &next->delta;
    next->delta = false;
  }
  if (this == (Vertex *)0x0) {
    local_768 = (Float *)0x0;
  }
  else {
    if (s < 1) {
      local_728.bits =
           (lightSampler->
           super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
           ).bits;
      FVar18 = Vertex::PdfLightOrigin
                         (this,&integrator->infiniteLights,local_780,
                          (LightSamplerHandle *)&local_728);
    }
    else {
      FVar18 = Vertex::PDF(target,integrator,prev,this);
    }
    local_768 = &this->pdfRev;
    local_76c = *local_768;
    *local_768 = FVar18;
  }
  if (local_780 == (Vertex *)0x0) {
    local_788 = (Float *)0x0;
    local_778 = (Float)s;
  }
  else {
    if (s < 1) {
      FVar18 = Vertex::PdfLight(this,integrator,local_780);
    }
    else {
      FVar18 = Vertex::PDF(this,integrator,target,local_780);
    }
    local_788 = &local_780->pdfRev;
    local_778 = *local_788;
    *local_788 = FVar18;
  }
  if (next == (Vertex *)0x0) {
    pFVar12 = (Float *)0x0;
  }
  else {
    FVar19 = Vertex::PDF(this,integrator,local_780,next);
    FVar18 = next->pdfRev;
    pFVar12 = &next->pdfRev;
    next->pdfRev = FVar19;
    local_780 = (Vertex *)(ulong)(uint)FVar18;
  }
  if (prev == (Vertex *)0x0) {
    pFVar11 = (Float *)0x0;
  }
  else {
    FVar18 = Vertex::PDF(next,integrator,this,prev);
    local_770 = prev->pdfRev;
    pFVar11 = &prev->pdfRev;
    prev->pdfRev = FVar18;
  }
  auVar21._8_4_ = 0x3f800000;
  auVar21._0_8_ = 0x3f8000003f800000;
  auVar21._12_4_ = 0x3f800000;
  fVar20 = 1.0;
  fVar15 = 0.0;
  do {
    pbVar7 = &cameraVertices[uVar13 - 1].delta;
    iVar8 = (int)uVar13 + 1;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 < 2) {
        fVar20 = 1.0;
        pFVar14 = &lightVertices[uVar9 - 1].pdfRev;
        while (0 < (int)uVar9) {
          FVar18 = pFVar14[-1];
          FVar19 = *pFVar14;
          if (uVar9 == 1) {
            bVar6 = Vertex::IsDeltaLight(lightVertices);
          }
          else {
            bVar6 = SUB41(pFVar14[-0x5a],0);
          }
          pbVar7 = (bool *)(pFVar14 + -2);
          pFVar14 = pFVar14 + -0x58;
          uVar9 = uVar9 - 1;
          uVar5 = vcmpss_avx512f(ZEXT416((uint)FVar19),ZEXT816(0) << 0x40,4);
          bVar2 = (bool)((byte)uVar5 & 1);
          uVar5 = vcmpss_avx512f(ZEXT416((uint)FVar18),ZEXT816(0) << 0x40,4);
          bVar3 = (bool)((byte)uVar5 & 1);
          fVar20 = fVar20 * ((float)((uint)bVar2 * (int)FVar19 + (uint)!bVar2 * 0x3f800000) /
                            (float)((uint)bVar3 * (int)FVar18 + (uint)!bVar3 * 0x3f800000));
          fVar15 = (float)((uint)((bVar6 | *pbVar7) & 1) * (int)fVar15 +
                          (uint)!(bool)((bVar6 | *pbVar7) & 1) * (int)(fVar15 + fVar20));
        }
        if (pFVar11 != (Float *)0x0) {
          *pFVar11 = local_770;
        }
        if (pFVar12 != (Float *)0x0) {
          *pFVar12 = local_780._0_4_;
        }
        if (local_788 != (Float *)0x0) {
          *local_788 = local_778;
        }
        if (local_768 != (Float *)0x0) {
          *local_768 = local_76c;
        }
        if (pbVar10 != (bool *)0x0) {
          *pbVar10 = local_7aa;
        }
        if (local_7a8 != (bool *)0x0) {
          *local_7a8 = local_7a9;
        }
        if (local_720 != (Vertex *)0x0) {
          memcpy(local_720,&local_718,0x160);
        }
        return 1.0 / (fVar15 + 1.0);
      }
      uVar1 = *(ulong *)(pbVar7 + 4);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar1;
      uVar13 = uVar13 - 1;
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + -0x160;
      uVar4 = vcmpps_avx512vl(auVar16,ZEXT416(0) << 0x40,4);
      auVar16 = vblendmps_avx512vl(auVar21,auVar16);
      bVar3 = (bool)((byte)uVar4 & 1);
      auVar17._0_4_ = (float)((uint)bVar3 * auVar16._0_4_ | (uint)!bVar3 * (int)uVar1);
      bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar17._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * (int)(uVar1 >> 0x20);
      auVar17._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar16._8_4_;
      auVar17._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar16._12_4_;
      auVar16 = vmovshdup_avx(auVar17);
      fVar20 = fVar20 * (auVar16._0_4_ / auVar17._0_4_);
    } while (bVar2 != false);
    fVar15 = (float)((uint)(*pbVar7 & 1) * (int)fVar15 +
                    (uint)!(bool)(*pbVar7 & 1) * (int)(fVar15 + fVar20));
  } while( true );
}

Assistant:

Float MISWeight(const Integrator &integrator, Vertex *lightVertices,
                Vertex *cameraVertices, Vertex &sampled, int s, int t,
                LightSamplerHandle lightSampler) {
    if (s + t == 2)
        return 1;
    Float sumRi = 0;
    // Define helper function _remap0_ that deals with Dirac delta functions
    auto remap0 = [](float f) -> Float { return f != 0 ? f : 1; };

    // Temporarily update vertex properties for current strategy
    // Look up connection vertices and their predecessors
    Vertex *qs = s > 0 ? &lightVertices[s - 1] : nullptr,
           *pt = t > 0 ? &cameraVertices[t - 1] : nullptr,
           *qsMinus = s > 1 ? &lightVertices[s - 2] : nullptr,
           *ptMinus = t > 1 ? &cameraVertices[t - 2] : nullptr;

    // Update sampled vertex for $s=1$ or $t=1$ strategy
    ScopedAssignment<Vertex> a1;
    if (s == 1)
        a1 = {qs, sampled};
    else if (t == 1)
        a1 = {pt, sampled};

    // Mark connection vertices as non-degenerate
    ScopedAssignment<bool> a2, a3;
    if (pt)
        a2 = {&pt->delta, false};
    if (qs)
        a3 = {&qs->delta, false};

    // Update reverse density of vertex $\pt{}_{t-1}$
    ScopedAssignment<Float> a4;
    if (pt)
        a4 = {&pt->pdfRev, s > 0 ? qs->PDF(integrator, qsMinus, *pt)
                                 : pt->PdfLightOrigin(integrator.infiniteLights, *ptMinus,
                                                      lightSampler)};

    // Update reverse density of vertex $\pt{}_{t-2}$
    ScopedAssignment<Float> a5;
    if (ptMinus)
        a5 = {&ptMinus->pdfRev, s > 0 ? pt->PDF(integrator, qs, *ptMinus)
                                      : pt->PdfLight(integrator, *ptMinus)};

    // Update reverse density of vertices $\pq{}_{s-1}$ and $\pq{}_{s-2}$
    ScopedAssignment<Float> a6;
    if (qs)
        a6 = {&qs->pdfRev, pt->PDF(integrator, ptMinus, *qs)};
    ScopedAssignment<Float> a7;
    if (qsMinus)
        a7 = {&qsMinus->pdfRev, qs->PDF(integrator, pt, *qsMinus)};

    // Consider hypothetical connection strategies along the camera subpath
    Float ri = 1;
    for (int i = t - 1; i > 0; --i) {
        ri *= remap0(cameraVertices[i].pdfRev) / remap0(cameraVertices[i].pdfFwd);
        if (!cameraVertices[i].delta && !cameraVertices[i - 1].delta)
            sumRi += ri;
    }

    // Consider hypothetical connection strategies along the light subpath
    ri = 1;
    for (int i = s - 1; i >= 0; --i) {
        ri *= remap0(lightVertices[i].pdfRev) / remap0(lightVertices[i].pdfFwd);
        bool deltaLightvertex =
            i > 0 ? lightVertices[i - 1].delta : lightVertices[0].IsDeltaLight();
        if (!lightVertices[i].delta && !deltaLightvertex)
            sumRi += ri;
    }

    return 1 / (1 + sumRi);
}